

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

void cleanup_profile(void)

{
  wchar_t local_10;
  int local_c;
  wchar_t j;
  wchar_t i;
  
  for (local_c = 0; local_c < (int)(uint)z_info->profile_max; local_c = local_c + 1) {
    for (local_10 = L'\0'; local_10 < cave_profiles[local_c].n_room_profiles;
        local_10 = local_10 + L'\x01') {
      string_free(cave_profiles[local_c].room_profiles[local_10].name);
    }
    mem_free(cave_profiles[local_c].room_profiles);
    string_free(cave_profiles[local_c].name);
  }
  mem_free(cave_profiles);
  return;
}

Assistant:

static void cleanup_profile(void)
{
	int i, j;
	for (i = 0; i < z_info->profile_max; i++) {
		for (j = 0; j < cave_profiles[i].n_room_profiles; j++)
			string_free((char *) cave_profiles[i].room_profiles[j].name);
		mem_free(cave_profiles[i].room_profiles);
		string_free((char *) cave_profiles[i].name);
	}
	mem_free(cave_profiles);
}